

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O3

bool __thiscall cmDocumentation::PrintHelpOneModule(cmDocumentation *this,ostream *os)

{
  pointer pcVar1;
  bool bVar2;
  ostream *poVar3;
  cmDocumentation *this_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string mname;
  undefined1 local_98 [32];
  string local_78 [8];
  pointer local_70;
  long local_68 [2];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_58;
  _Alloc_hider local_40;
  long *local_38;
  undefined8 local_30;
  
  this_00 = (cmDocumentation *)local_98;
  pcVar1 = (this->CurrentArgument)._M_dataplus._M_p;
  local_78 = (string  [8])local_68;
  std::__cxx11::string::_M_construct<char*>
            (local_78,pcVar1,pcVar1 + (this->CurrentArgument)._M_string_length);
  local_58.first._M_len = 7;
  local_58.first._M_str = "module/";
  local_58.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_40._M_p = local_70;
  local_38 = (long *)local_78;
  local_30 = 0;
  views._M_len = 2;
  views._M_array = &local_58;
  cmCatViews((string *)local_98,views);
  bVar2 = PrintFiles(this_00,os,(string *)local_98);
  if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
    operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
  }
  if (!bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"Argument \"",10);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,(this->CurrentArgument)._M_dataplus._M_p,
                        (this->CurrentArgument)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"\" to --help-module is not a CMake module.\n",0x2a);
  }
  if (local_78 != (string  [8])local_68) {
    operator_delete((void *)local_78,local_68[0] + 1);
  }
  return bVar2;
}

Assistant:

bool cmDocumentation::PrintHelpOneModule(std::ostream& os)
{
  std::string mname = this->CurrentArgument;
  if (this->PrintFiles(os, cmStrCat("module/", mname))) {
    return true;
  }
  // Argument was not a module.  Complain.
  os << "Argument \"" << this->CurrentArgument
     << "\" to --help-module is not a CMake module.\n";
  return false;
}